

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O3

void glucose_print_stats(SimpSolver *s,abctime clk)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = (double)(clk & 0xffffffff) / 1000000.0;
  dVar4 = Gluco::memUsed();
  lVar1 = (s->super_Solver).starts;
  if (lVar1 < 1) {
    lVar2 = 0;
  }
  else {
    lVar2 = (s->super_Solver).conflicts / lVar1;
  }
  printf("c restarts              : %d (%d conflicts on average)\n",lVar1,lVar2);
  printf("c blocked restarts      : %d (multiple: %d) \n",
         (ulong)(uint)(s->super_Solver).nbstopsrestarts,
         (ulong)(uint)(s->super_Solver).nbstopsrestartssame);
  printf("c last block at restart : %d\n",(ulong)(uint)(s->super_Solver).lastblockatrestart);
  printf("c nb ReduceDB           : %-12d\n",(ulong)(uint)(s->super_Solver).nbReduceDB);
  printf("c nb removed Clauses    : %-12d\n",(ulong)(uint)(s->super_Solver).nbRemovedClauses);
  printf("c nb learnts DL2        : %-12d\n",(ulong)(uint)(s->super_Solver).nbDL2);
  printf("c nb learnts size 2     : %-12d\n",(ulong)(uint)(s->super_Solver).nbBin);
  printf("c nb learnts size 1     : %-12d\n",(ulong)(uint)(s->super_Solver).nbUn);
  printf("c conflicts             : %-12d  (%.0f /sec)\n",
         (double)(s->super_Solver).conflicts / dVar3);
  lVar1 = (s->super_Solver).decisions;
  printf("c decisions             : %-12d  (%4.2f %% random) (%.0f /sec)\n",
         (double)(((float)(s->super_Solver).rnd_decisions * 100.0) / (float)lVar1),
         (double)lVar1 / dVar3);
  printf("c propagations          : %-12d  (%.0f /sec)\n",
         (double)(s->super_Solver).propagations / dVar3);
  lVar1 = (s->super_Solver).max_literals;
  printf("c conflict literals     : %-12d  (%4.2f %% deleted)\n",
         (double)((lVar1 - (s->super_Solver).tot_literals) * 100) / (double)lVar1);
  printf("c nb reduced Clauses    : %-12d\n",(ulong)(uint)(s->super_Solver).nbReducedClauses);
  if ((dVar4 == 0.0) && (!NAN(dVar4))) {
    return;
  }
  printf("Memory used           : %.2f MB\n",dVar4);
  return;
}

Assistant:

void glucose_print_stats(SimpSolver& s, abctime clk)
{
    double cpu_time = (double)(unsigned)clk / CLOCKS_PER_SEC;
    double mem_used = memUsed();
    printf("c restarts              : %d (%d conflicts on average)\n",         (int)s.starts, s.starts > 0 ? (int)(s.conflicts/s.starts) : 0);
    printf("c blocked restarts      : %d (multiple: %d) \n",                   (int)s.nbstopsrestarts, (int)s.nbstopsrestartssame);
    printf("c last block at restart : %d\n",                                   (int)s.lastblockatrestart);
    printf("c nb ReduceDB           : %-12d\n",                                (int)s.nbReduceDB);
    printf("c nb removed Clauses    : %-12d\n",                                (int)s.nbRemovedClauses);
    printf("c nb learnts DL2        : %-12d\n",                                (int)s.nbDL2);
    printf("c nb learnts size 2     : %-12d\n",                                (int)s.nbBin);
    printf("c nb learnts size 1     : %-12d\n",                                (int)s.nbUn);
    printf("c conflicts             : %-12d  (%.0f /sec)\n",                   (int)s.conflicts,    s.conflicts   /cpu_time);
    printf("c decisions             : %-12d  (%4.2f %% random) (%.0f /sec)\n", (int)s.decisions,    (float)s.rnd_decisions*100 / (float)s.decisions, s.decisions   /cpu_time);
    printf("c propagations          : %-12d  (%.0f /sec)\n",                   (int)s.propagations, s.propagations/cpu_time);
    printf("c conflict literals     : %-12d  (%4.2f %% deleted)\n",            (int)s.tot_literals, (s.max_literals - s.tot_literals)*100 / (double)s.max_literals);
    printf("c nb reduced Clauses    : %-12d\n", (int)s.nbReducedClauses);
    if (mem_used != 0) printf("Memory used           : %.2f MB\n", mem_used);
    //printf("c CPU time              : %.2f sec\n", cpu_time);
}